

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_lzw.c
# Opt level: O2

int LZWSetupEncode(TIFF *tif)

{
  uint8_t *puVar1;
  void *pvVar2;
  
  puVar1 = tif->tif_data;
  if (puVar1 == (uint8_t *)0x0) {
    __assert_fail("sp != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_lzw.c"
                  ,0x407,"int LZWSetupEncode(TIFF *)");
  }
  pvVar2 = _TIFFmallocExt(tif,0x23290);
  *(void **)(puVar1 + 0x120) = pvVar2;
  if (pvVar2 == (void *)0x0) {
    TIFFErrorExtR(tif,"LZWSetupEncode","No space for LZW hash table");
  }
  return (uint)(pvVar2 != (void *)0x0);
}

Assistant:

static int LZWSetupEncode(TIFF *tif)
{
    static const char module[] = "LZWSetupEncode";
    LZWCodecState *sp = EncoderState(tif);

    assert(sp != NULL);
    sp->enc_hashtab = (hash_t *)_TIFFmallocExt(tif, HSIZE * sizeof(hash_t));
    if (sp->enc_hashtab == NULL)
    {
        TIFFErrorExtR(tif, module, "No space for LZW hash table");
        return (0);
    }
    return (1);
}